

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorShower::hsvEd(QColorShower *this)

{
  QLineEdit *this_00;
  int iVar1;
  uint uVar2;
  long in_FS_OFFSET;
  QRgb local_5c [2];
  undefined2 local_54;
  undefined6 local_52;
  undefined2 uStack_4c;
  undefined2 uStack_4a;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this->rgbOriginal = false;
  iVar1 = QSpinBox::value(&this->hEd->super_QSpinBox);
  this->hue = iVar1;
  iVar1 = QSpinBox::value(&this->sEd->super_QSpinBox);
  this->sat = iVar1;
  iVar1 = QSpinBox::value(&this->vEd->super_QSpinBox);
  this->val = iVar1;
  uStack_4a = 0xaaaa;
  local_5c[1] = 0;
  local_54 = 0xffff;
  local_52 = 0;
  uStack_4c = 0;
  QColor::setHsv((int)(local_5c + 1),this->hue,this->sat,iVar1);
  uVar2 = QColor::rgb();
  this->curCol = uVar2;
  QColSpinBox::setValue(this->rEd,uVar2 >> 0x10 & 0xff);
  QColSpinBox::setValue(this->gEd,(uint)*(byte *)((long)&this->curCol + 1));
  QColSpinBox::setValue(this->bEd,(uint)(byte)this->curCol);
  this_00 = this->htEd;
  QColor::name((NameFormat)&local_48);
  QLineEdit::setText(this_00,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  showCurrentColor(this);
  local_5c[0] = this->curCol;
  local_48.d.ptr = (char16_t *)local_5c;
  local_48.d.d = (Data *)0x0;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_48);
  updateQColor(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::hsvEd()
{
    rgbOriginal = false;
    hue = hEd->value();
    sat = sEd->value();
    val = vEd->value();

    QColor c;
    c.setHsv(hue, sat, val);
    curCol = c.rgb();

    rEd->setValue(qRed(currentColor()));
    gEd->setValue(qGreen(currentColor()));
    bEd->setValue(qBlue(currentColor()));

    htEd->setText(c.name());

    showCurrentColor();
    emit newCol(currentColor());
    updateQColor();
}